

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

void effect_simple(wchar_t index,source origin,char *dice_string,wchar_t subtype,wchar_t radius,
                  wchar_t other,wchar_t y,wchar_t x,_Bool *ident)

{
  _Bool _Var1;
  source origin_00;
  _Bool local_6d;
  wchar_t local_6c;
  undefined1 local_68 [3];
  _Bool dummy_ident;
  wchar_t dir;
  effect effect;
  wchar_t radius_local;
  wchar_t subtype_local;
  char *dice_string_local;
  wchar_t index_local;
  source origin_local;
  
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  local_6c = L'\x05';
  local_6d = false;
  effect.msg._0_4_ = radius;
  effect.msg._4_4_ = subtype;
  memset(local_68,0,0x38);
  effect.next._0_2_ = (undefined2)index;
  effect._8_8_ = dice_new();
  dice_parse_string((dice_t *)effect._8_8_,dice_string);
  effect.y = effect.msg._4_4_;
  effect.x = (wchar_t)effect.msg;
  effect.subtype = other;
  effect.dice._0_4_ = y;
  effect.dice._4_4_ = x;
  _Var1 = effect_aim((effect *)local_68);
  if (_Var1) {
    get_aim_dir(&local_6c);
  }
  if (ident == (_Bool *)0x0) {
    ident = &local_6d;
  }
  origin_00._4_4_ = 0;
  effect_do((effect *)local_68,origin_00,(object *)0x0,ident,true,local_6c,L'\0',L'\0',
            (command_conflict *)0x0);
  dice_free((dice_t *)effect._8_8_);
  return;
}

Assistant:

void effect_simple(int index,
				   struct source origin,
				   const char *dice_string,
				   int subtype,
				   int radius,
				   int other,
				   int y,
				   int x,
				   bool *ident)
{
	struct effect effect;
	int dir = DIR_TARGET;
	bool dummy_ident = false;

	/* Set all the values */
	memset(&effect, 0, sizeof(effect));
	effect.index = index;
	effect.dice = dice_new();
	dice_parse_string(effect.dice, dice_string);
	effect.subtype = subtype;
	effect.radius = radius;
	effect.other = other;
	effect.y = y;
	effect.x = x;

	/* Direction if needed */
	if (effect_aim(&effect))
		get_aim_dir(&dir);

	/* Do the effect */
	if (!ident) {
		ident = &dummy_ident;
	}

	effect_do(&effect, origin, NULL, ident, true, dir, 0, 0, NULL);
	dice_free(effect.dice);
}